

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cc
# Opt level: O2

void * tt::detail::startThread(void *obj)

{
  ThreadData::runInThread((ThreadData *)obj);
  ThreadData::~ThreadData((ThreadData *)obj);
  operator_delete(obj);
  return (void *)0x0;
}

Assistant:

void* startThread(void* obj){
		ThreadData* data = static_cast<ThreadData*>(obj);

		data->runInThread();

		delete data;

		return NULL;
	}